

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O2

void Kit_DsdCompSort(int *pPrios,uint *uSupps,unsigned_short *piLits,int nVars,uint *piLitsRes)

{
  uint uWord;
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  int Priority [16];
  int pOrder [16];
  int nSuppSizes [16];
  
  uVar5 = 0;
  uVar7 = 0;
  if (0 < nVars) {
    uVar7 = (ulong)(uint)nVars;
  }
  for (; uVar5 != uVar7; uVar5 = uVar5 + 1) {
    uWord = uSupps[uVar5];
    if (uWord == 0) {
      __assert_fail("uSupps[i]",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                    ,0x5d8,
                    "void Kit_DsdCompSort(int *, unsigned int *, unsigned short *, int, unsigned int *)"
                   );
    }
    pOrder[uVar5] = (int)uVar5;
    Priority[uVar5] = 100000000;
    iVar2 = 100000000;
    for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
      if ((uWord >> ((uint)lVar4 & 0x1f) & 1) != 0) {
        if (pPrios[lVar4] <= iVar2) {
          iVar2 = pPrios[lVar4];
        }
        Priority[uVar5] = iVar2;
      }
    }
    if (iVar2 == 0x10) {
      __assert_fail("Priority[i] != 16",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                    ,0x5de,
                    "void Kit_DsdCompSort(int *, unsigned int *, unsigned short *, int, unsigned int *)"
                   );
    }
    iVar2 = Kit_WordCountOnes(uWord);
    nSuppSizes[uVar5] = iVar2;
  }
  uVar6 = 0;
  Extra_BubbleSort(pOrder,Priority,nVars,0);
  uVar5 = 0xffffffffffffffff;
  iVar2 = 0;
  iVar3 = 0;
  do {
    if (uVar7 == uVar6) {
      iVar2 = (int)uVar5;
      if (iVar2 == -1) {
        __assert_fail("iVarBest != -1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                      ,0x5f0,
                      "void Kit_DsdCompSort(int *, unsigned int *, unsigned short *, int, unsigned int *)"
                     );
      }
      *piLitsRes = (uint)piLits[iVar2];
      iVar3 = 1;
      for (uVar5 = 0; uVar7 != uVar5; uVar5 = uVar5 + 1) {
        if (pOrder[uVar5] != iVar2) {
          lVar4 = (long)iVar3;
          iVar3 = iVar3 + 1;
          piLitsRes[lVar4] = (uint)piLits[pOrder[uVar5]];
        }
      }
      if (iVar3 == nVars) {
        return;
      }
      __assert_fail("k == nVars",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                    ,0x5fa,
                    "void Kit_DsdCompSort(int *, unsigned int *, unsigned short *, int, unsigned int *)"
                   );
    }
    iVar1 = nSuppSizes[uVar6];
    if (iVar2 < iVar1) {
      iVar8 = Priority[uVar6];
LAB_0047eb5b:
      uVar5 = uVar6 & 0xffffffff;
      iVar2 = iVar1;
      iVar3 = iVar8;
    }
    else if ((iVar2 == iVar1) && (iVar8 = Priority[uVar6], iVar3 < iVar8)) goto LAB_0047eb5b;
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

void Kit_DsdCompSort( int pPrios[], unsigned uSupps[], unsigned short * piLits, int nVars, unsigned piLitsRes[] )
{
    int nSuppSizes[16], Priority[16], pOrder[16];
    int i, k, iVarBest, SuppMax, PrioMax;
    // compute support sizes and priorities of the components
    for ( i = 0; i < nVars; i++ )
    {
        assert( uSupps[i] );
        pOrder[i] = i;
        Priority[i] = KIT_INFINITY;
        for ( k = 0; k < 16; k++ )
            if ( uSupps[i] & (1 << k) )
                Priority[i] = KIT_MIN( Priority[i], pPrios[k] );
        assert( Priority[i] != 16 );
        nSuppSizes[i] = Kit_WordCountOnes(uSupps[i]);
    }
    // sort the components by pririty
    Extra_BubbleSort( pOrder, Priority, nVars, 0 );
    // find the component by with largest size and lowest priority
    iVarBest = -1;
    SuppMax  = 0;
    PrioMax  = 0;
    for ( i = 0; i < nVars; i++ )
    {
        if ( SuppMax < nSuppSizes[i] || (SuppMax == nSuppSizes[i] && PrioMax < Priority[i]) )
        {
            SuppMax  = nSuppSizes[i];
            PrioMax  = Priority[i];
            iVarBest = i;
        }
    }
    assert( iVarBest != -1 );
    // copy the resulting literals
    k = 0;
    piLitsRes[k++] = piLits[iVarBest];
    for ( i = 0; i < nVars; i++ )
    {
        if ( pOrder[i] == iVarBest )
            continue;
        piLitsRes[k++] = piLits[pOrder[i]];
    }
    assert( k == nVars );
}